

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O0

int sinfl_decompress(uchar *out,uchar *in,int size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *end;
  unsigned_long w_1;
  int wcnt;
  unsigned_long w;
  uchar c;
  int offs;
  int dsym;
  int len_1;
  int sym_1;
  int i_1;
  int sym;
  int nlen;
  int ndist;
  int nlit;
  uchar lens_1 [320];
  uchar nlens [19];
  uint local_1ec8 [2];
  uint hlens [128];
  int local_1cc0;
  int local_1cbc;
  int i;
  int n_1;
  uchar lens [320];
  int n;
  int len;
  int type;
  int last;
  sinfl s;
  sinfl_states state;
  uchar *o;
  uchar *e;
  uchar *puStack_20;
  int size_local;
  uchar *in_local;
  uchar *out_local;
  
  end = in + size;
  s.dsts[400] = 0;
  unique0x100006fe = out;
  puStack_20 = in;
  in_local = out;
  memset(&type,0,0x1b28);
  len = 0;
  sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,0);
  do {
    if (end <= puStack_20 && last == 0) {
      return (int)in_local - (int)stack0xffffffffffffffc8;
    }
    switch(s.dsts[400]) {
    case 0:
      len = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,1);
      iVar4 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,2);
      if (iVar4 == 0) {
        s.dsts[400] = 1;
      }
      else if (iVar4 == 1) {
        s.dsts[400] = 2;
      }
      else {
        if (iVar4 != 2) {
          return (int)in_local - (int)stack0xffffffffffffffc8;
        }
        s.dsts[400] = 3;
      }
      break;
    case 1:
      sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,last & 7);
      iVar4 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,0x10);
      puStack_20 = puStack_20 + -2;
      last = 0;
      if (((long)end - (long)puStack_20 < (long)iVar4) || (iVar4 == 0)) {
        return (int)in_local - (int)stack0xffffffffffffffc8;
      }
      memcpy(in_local,puStack_20,(long)iVar4);
      puStack_20 = puStack_20 + iVar4;
      s.dsts[400] = 0;
      in_local = in_local + iVar4;
      break;
    case 2:
      lens[0x13c] = '\0';
      lens[0x13d] = '\0';
      lens[0x13e] = '\0';
      lens[0x13f] = '\0';
      for (; (int)lens._316_4_ < 0x90; lens._316_4_ = lens._316_4_ + 1) {
        *(undefined1 *)((long)&i + (long)(int)lens._316_4_) = 8;
      }
      lens[0x13c] = 0x90;
      lens[0x13d] = '\0';
      lens[0x13e] = '\0';
      lens[0x13f] = '\0';
      for (; (int)lens._316_4_ < 0x100; lens._316_4_ = lens._316_4_ + 1) {
        *(undefined1 *)((long)&i + (long)(int)lens._316_4_) = 9;
      }
      lens[0x13c] = '\0';
      lens[0x13d] = '\x01';
      lens[0x13e] = '\0';
      lens[0x13f] = '\0';
      for (; (int)lens._316_4_ < 0x118; lens._316_4_ = lens._316_4_ + 1) {
        *(undefined1 *)((long)&i + (long)(int)lens._316_4_) = 7;
      }
      lens[0x13c] = '\x18';
      lens[0x13d] = '\x01';
      lens[0x13e] = '\0';
      lens[0x13f] = '\0';
      for (; (int)lens._316_4_ < 0x120; lens._316_4_ = lens._316_4_ + 1) {
        *(undefined1 *)((long)&i + (long)(int)lens._316_4_) = 8;
      }
      lens[0x13c] = '\0';
      lens[0x13d] = '\0';
      lens[0x13e] = '\0';
      lens[0x13f] = '\0';
      for (; (int)lens._316_4_ < 0x20; lens._316_4_ = lens._316_4_ + 1) {
        *(undefined1 *)((long)&i + (long)(lens._316_4_ + 0x120)) = 5;
      }
      sinfl_build((uint *)&s,(uchar *)&i,10,0xf,0x120);
      sinfl_build(s.lits + 0x534,lens + 0x118,8,0xf,0x20);
      s.dsts[400] = 4;
      break;
    case 3:
      memset(lens_1 + 0x138,0,0x13);
      iVar4 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,5);
      iVar4 = iVar4 + 0x101;
      iVar5 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,5);
      iVar2 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,4);
      for (local_1cbc = 0; local_1cbc < iVar2 + 4; local_1cbc = local_1cbc + 1) {
        iVar3 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,3);
        lens_1[(ulong)"\x10\x11\x12"[local_1cbc] + 0x138] = (uchar)iVar3;
      }
      sinfl_build(local_1ec8,lens_1 + 0x138,7,7,0x13);
      local_1cbc = 0;
      while (local_1cbc < iVar4 + iVar5 + 1) {
        iVar2 = sinfl_decode(&stack0xffffffffffffffe0,end,(sinfl *)&type,local_1ec8,7);
        if (iVar2 == 0x10) {
          local_1cc0 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,2);
          for (local_1cc0 = local_1cc0 + 3; local_1cc0 != 0; local_1cc0 = local_1cc0 + -1) {
            *(undefined1 *)((long)&ndist + (long)local_1cbc) =
                 *(undefined1 *)((long)&ndist + (long)(local_1cbc + -1));
            local_1cbc = local_1cbc + 1;
          }
        }
        else if (iVar2 == 0x11) {
          local_1cc0 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,3);
          for (local_1cc0 = local_1cc0 + 3; local_1cc0 != 0; local_1cc0 = local_1cc0 + -1) {
            *(undefined1 *)((long)&ndist + (long)local_1cbc) = 0;
            local_1cbc = local_1cbc + 1;
          }
        }
        else if (iVar2 == 0x12) {
          local_1cc0 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,7);
          for (local_1cc0 = local_1cc0 + 0xb; local_1cc0 != 0; local_1cc0 = local_1cc0 + -1) {
            *(undefined1 *)((long)&ndist + (long)local_1cbc) = 0;
            local_1cbc = local_1cbc + 1;
          }
        }
        else {
          *(char *)((long)&ndist + (long)local_1cbc) = (char)iVar2;
          local_1cbc = local_1cbc + 1;
        }
      }
      sinfl_build((uint *)&s,(uchar *)&ndist,10,0xf,iVar4);
      sinfl_build(s.lits + 0x534,(uchar *)((long)&ndist + (long)iVar4),8,0xf,iVar5 + 1);
      s.dsts[400] = 4;
      break;
    case 4:
      iVar4 = sinfl_decode(&stack0xffffffffffffffe0,end,(sinfl *)&type,(uint *)&s,10);
      if (iVar4 < 0x101) {
        if (iVar4 == 0x100) {
          if (len != 0) {
            return (int)in_local - (int)stack0xffffffffffffffc8;
          }
          s.dsts[400] = 0;
        }
        else {
          *in_local = (uchar)iVar4;
          in_local = in_local + 1;
        }
      }
      else {
        iVar5 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,(uint)""[iVar4 + -0x101]);
        offs = iVar5 + sinfl_decompress::lbase[iVar4 + -0x101];
        iVar4 = sinfl_decode(&stack0xffffffffffffffe0,end,(sinfl *)&type,s.lits + 0x534,8);
        iVar5 = sinfl_get(&stack0xffffffffffffffe0,end,(sinfl *)&type,(uint)""[iVar4]);
        iVar5 = iVar5 + sinfl_decompress::dbase[iVar4];
        if ((int)in_local - (int)stack0xffffffffffffffc8 < iVar5) {
          return (int)in_local - (int)stack0xffffffffffffffc8;
        }
        if (iVar5 == 1) {
          bVar1 = in_local[-1];
          for (len_1 = 0; len_1 < offs >> 2; len_1 = len_1 + 1) {
            *(uint *)in_local =
                 (uint)bVar1 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar1 << 8 | (uint)bVar1;
            in_local = in_local + 4;
          }
          offs = offs & 3;
        }
        else if (3 < iVar5) {
          for (len_1 = 0; len_1 < offs >> 2; len_1 = len_1 + 1) {
            *(undefined4 *)in_local = *(undefined4 *)(in_local + -(long)iVar5);
            in_local = in_local + 4;
          }
          offs = offs & 3;
        }
        for (len_1 = 0; len_1 < offs; len_1 = len_1 + 1) {
          *in_local = in_local[-(long)iVar5];
          in_local = in_local + 1;
        }
      }
    }
  } while( true );
}

Assistant:

static int
sinfl_decompress(unsigned char *out, const unsigned char *in, int size) {
  static const unsigned char order[] = {16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15};
  static const short dbase[30+2] = {1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,
      257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577};
  static const unsigned char dbits[30+2] = {0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,
      10,10,11,11,12,12,13,13,0,0};
  static const short lbase[29+2] = {3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,
      43,51,59,67,83,99,115,131,163,195,227,258,0,0};
  static const unsigned char lbits[29+2] = {0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,
      4,4,4,5,5,5,5,0,0,0};

  const unsigned char *e = in + size, *o = out;
  enum sinfl_states {hdr,stored,fixed,dyn,blk};
  enum sinfl_states state = hdr;
  struct sinfl s = {0};
  int last = 0;

  sinfl_get(&in,e,&s,0); /* buffer input */
  while (in < e || s.bitcnt) {
    switch (state) {
    case hdr: {
      int type = 0; /* block header */
      last = sinfl_get(&in,e,&s,1);
      type = sinfl_get(&in,e,&s,2);

      switch (type) {default: return (int)(out-o);
      case 0x00: state = stored; break;
      case 0x01: state = fixed; break;
      case 0x02: state = dyn; break;}
    } break;
    case stored: {
      int len; /* uncompressed block */
      sinfl_get(&in,e,&s,s.bitcnt & 7);
      len = sinfl_get(&in,e,&s,16);
      //int nlen = sinfl_get(&in,e,&s,16);
      in -= 2; s.bitcnt = 0;

      if (len > (e-in) || !len)
        return (int)(out-o);
      memcpy(out, in, (size_t)len);
      in += len, out += len;
      state = hdr;
    } break;
    case fixed: {
      /* fixed huffman codes */
      int n; unsigned char lens[288+32];
      for (n = 0; n <= 143; n++) lens[n] = 8;
      for (n = 144; n <= 255; n++) lens[n] = 9;
      for (n = 256; n <= 279; n++) lens[n] = 7;
      for (n = 280; n <= 287; n++) lens[n] = 8;
      for (n = 0; n < 32; n++) lens[288+n] = 5;

      /* build lit/dist tables */
      sinfl_build(s.lits, lens, 10, 15, 288);
      sinfl_build(s.dsts, lens + 288, 8, 15, 32);
      state = blk;
    } break;
    case dyn: {
        /* dynamic huffman codes */
        int n, i;
        unsigned hlens[SINFL_PRE_TBL_SIZE];
        unsigned char nlens[19] = {0}, lens[288+32];
        int nlit = 257 + sinfl_get(&in,e,&s,5);
        int ndist = 1 + sinfl_get(&in,e,&s,5);
        int nlen = 4 + sinfl_get(&in,e,&s,4);
        for (n = 0; n < nlen; n++)
          nlens[order[n]] = (unsigned char)sinfl_get(&in,e,&s,3);
        sinfl_build(hlens, nlens, 7, 7, 19);

        /* decode code lengths */
        for (n = 0; n < nlit + ndist;) {
          int sym = sinfl_decode(&in, e, &s, hlens, 7);
          switch (sym) {default: lens[n++] = (unsigned char)sym; break;
          case 16: for (i=3+sinfl_get(&in,e,&s,2);i;i--,n++) lens[n]=lens[n-1]; break;
          case 17: for (i=3+sinfl_get(&in,e,&s,3);i;i--,n++) lens[n]=0; break;
          case 18: for (i=11+sinfl_get(&in,e,&s,7);i;i--,n++) lens[n]=0; break;}
        }
        /* build lit/dist tables */
        sinfl_build(s.lits, lens, 10, 15, nlit);
        sinfl_build(s.dsts, lens + nlit, 8, 15, ndist);
        state = blk;
    } break;
    case blk: {
      /* decompress block */
      int i, sym = sinfl_decode(&in, e, &s, s.lits, 10);
      if (sym > 256) {sym -= 257; /* match symbol */
        {int len = sinfl_get(&in, e, &s, lbits[sym]) + lbase[sym];
        int dsym = sinfl_decode(&in, e, &s, s.dsts, 8);
        int offs = sinfl_get(&in, e, &s, dbits[dsym]) + dbase[dsym];
        if (offs > (int)(out-o)) {
          return (int)(out-o);
        } else if (offs == 1) {
          /* rle match copying */
          unsigned char c = *(out - offs);
          unsigned long w = (c << 24) | (c << 16) | (c << 8) | c;
          for (i = 0; i < len >> 2; ++i) {
            memcpy(out, &w, 4);
            out += 4;
          }
          len = len & 3;
        } else if (offs >= 4) {
          /* copy match */
          int wcnt = len >> 2;
          for (i = 0; i < wcnt; ++i) {
            unsigned long w = 0;
            memcpy(&w, out - offs, 4);
            memcpy(out, &w, 4);
            out += 4;
          }
          len = len & 3;
        }
        for (i = 0; i < len; ++i)
          {*out = *(out-offs), out++;}
        }
      } else if (sym == 256) {
        /* end of block */
        if (last) return (int)(out-o);
        state = hdr;
        break;
        /* literal */
      } else *out++ = (unsigned char)sym;
    } break;}
  }
  return (int)(out-o);
}